

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_has_task(lgx_vm_t *vm)

{
  int iVar1;
  lgx_vm_t *vm_local;
  
  if (vm->co_running == (lgx_co_t *)0x0) {
    iVar1 = lgx_list_empty(&vm->co_ready);
    if (iVar1 == 0) {
      vm_local._4_4_ = 1;
    }
    else {
      iVar1 = lgx_list_empty(&vm->co_suspend);
      if (iVar1 == 0) {
        vm_local._4_4_ = 1;
      }
      else {
        vm_local._4_4_ = 0;
      }
    }
  }
  else {
    vm_local._4_4_ = 1;
  }
  return vm_local._4_4_;
}

Assistant:

int lgx_co_has_task(lgx_vm_t *vm) {
    if (vm->co_running) {
        return 1;
    }

    if (!lgx_list_empty(&vm->co_ready)) {
        return 1;
    }

    if (!lgx_list_empty(&vm->co_suspend)) {
        return 1;
    }

    return 0;
}